

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# def_use_manager.cpp
# Opt level: O3

bool __thiscall
spvtools::opt::analysis::DefUseManager::WhileEachUser
          (DefUseManager *this,Instruction *def,function<bool_(spvtools::opt::Instruction_*)> *f)

{
  _Rb_tree_header *p_Var1;
  byte bVar2;
  bool bVar3;
  const_iterator cVar4;
  Instruction *pIVar5;
  const_iterator cVar6;
  Instruction *local_40;
  uint32_t local_34;
  
  if (def != (Instruction *)0x0) {
    bVar2 = def->has_result_id_;
    if ((bool)bVar2 == true) {
      local_34 = Instruction::GetSingleWordOperand(def,(uint)def->has_type_id_);
      cVar4 = std::
              _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      *)this,&local_34);
      if (cVar4.
          super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_false>
          ._M_cur == (__node_type *)0x0) {
        pIVar5 = (Instruction *)0x0;
      }
      else {
        pIVar5 = *(Instruction **)
                  ((long)cVar4.
                         super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_false>
                         ._M_cur + 0x10);
      }
      if (pIVar5 != def) goto LAB_00596dd7;
      bVar2 = def->has_result_id_;
    }
    if ((bVar2 & 1) != 0) {
      p_Var1 = &(this->id_to_users_)._M_t._M_impl.super__Rb_tree_header;
      cVar6 = UsersBegin(this,def);
      if ((_Rb_tree_header *)cVar6._M_node != p_Var1) {
        do {
          if (*(Instruction **)(cVar6._M_node + 1) != def) {
            return true;
          }
          local_40 = (Instruction *)cVar6._M_node[1]._M_parent;
          if ((f->super__Function_base)._M_manager == (_Manager_type)0x0) {
            std::__throw_bad_function_call();
          }
          bVar3 = (*f->_M_invoker)((_Any_data *)f,&local_40);
          if (!bVar3) {
            return false;
          }
          cVar6._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar6._M_node);
        } while ((_Rb_tree_header *)cVar6._M_node != p_Var1);
      }
    }
    return true;
  }
LAB_00596dd7:
  __assert_fail("def && (!def->HasResultId() || def == GetDef(def->result_id())) && \"Definition is not registered.\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/def_use_manager.cpp"
                ,0x76,
                "bool spvtools::opt::analysis::DefUseManager::WhileEachUser(const Instruction *, const std::function<bool (Instruction *)> &) const"
               );
}

Assistant:

bool DefUseManager::WhileEachUser(
    const Instruction* def, const std::function<bool(Instruction*)>& f) const {
  // Ensure that |def| has been registered.
  assert(def && (!def->HasResultId() || def == GetDef(def->result_id())) &&
         "Definition is not registered.");
  if (!def->HasResultId()) return true;

  auto end = id_to_users_.end();
  for (auto iter = UsersBegin(def); UsersNotEnd(iter, end, def); ++iter) {
    if (!f(iter->user)) return false;
  }
  return true;
}